

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

index_t __thiscall GEO::Delaunay3d::nearest_vertex(Delaunay3d *this,double *p)

{
  index_t iVar1;
  bool bVar2;
  index_t iVar3;
  index_t iVar4;
  long lVar5;
  coord_index_t i;
  long lVar6;
  double dVar7;
  double result;
  double dVar8;
  double dVar9;
  
  if (((this->weighted_ == false) &&
      (iVar3 = locate(this,p,0xffffffff,(this->super_Delaunay).neighbors_.thread_safe_,(Sign *)0x0),
      iVar3 != 0xffffffff)) && (bVar2 = tet_is_virtual(this,iVar3), !bVar2)) {
    dVar7 = 1e+30;
    iVar4 = 0xffffffff;
    lVar5 = 0;
    do {
      iVar1 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start[(ulong)(iVar3 << 2) + lVar5];
      if (-1 < (int)iVar1) {
        dVar8 = 0.0;
        lVar6 = 0;
        do {
          dVar9 = (this->super_Delaunay).vertices_
                  [(ulong)((this->super_Delaunay).vertex_stride_ * iVar1) + lVar6] - p[lVar6];
          dVar8 = dVar8 + dVar9 * dVar9;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        if (dVar8 < dVar7) {
          dVar7 = dVar8;
          iVar4 = iVar1;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    return iVar4;
  }
  iVar3 = Delaunay::nearest_vertex(&this->super_Delaunay,p);
  return iVar3;
}

Assistant:

index_t Delaunay3d::nearest_vertex(const double* p) const {

        // TODO: For the moment, we fallback to the (unefficient)
        // baseclass implementation when in weighted mode.
        if(weighted_) {
            return Delaunay::nearest_vertex(p);
        }

        // Find a tetrahedron (real or virtual) that contains p
        index_t t = locate(p, NO_TETRAHEDRON, thread_safe());

        //   If p is outside the convex hull of the inserted points,
        // a special traversal is required (not implemented yet).
        // TODO: implement convex hull boundary traversal
        // (for now we fallback to linear search implemented
        //  in baseclass)
        if(t == NO_TETRAHEDRON || tet_is_virtual(t)) {
            return Delaunay::nearest_vertex(p);
        }

        double sq_dist = 1e30;
        index_t result = NO_TETRAHEDRON;

        // Find the nearest vertex among t's vertices
        for(index_t lv = 0; lv < 4; ++lv) {
            signed_index_t v = tet_vertex(t, lv);
            // If the tetrahedron is virtual, then the first vertex
            // is the vertex at infinity and is skipped.
            if(v < 0) {
                continue;
            }
            double cur_sq_dist = Geom::distance2(p, vertex_ptr(index_t(v)), 3);
            if(cur_sq_dist < sq_dist) {
                sq_dist = cur_sq_dist;
                result = index_t(v);
            }
        }
        return result;
    }